

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recycle.c
# Opt level: O0

void free_pcdata(PC_DATA *pcdata)

{
  PC_DATA *in_RDI;
  int i;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  int iVar1;
  
  if ((in_RDI != (PC_DATA *)0x0) && ((in_RDI->valid & 1U) != 0)) {
    free_pstring((char *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
    free_pstring((char *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
    free_pstring((char *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
    free_pstring((char *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
    free_buf((BUFFER *)0x624ce7);
    for (iVar1 = 0; iVar1 < 100; iVar1 = iVar1 + 1) {
      if (in_RDI->recentkills[iVar1] != (char *)0x0) {
        free_pstring((char *)CONCAT44(iVar1,in_stack_fffffffffffffff0));
      }
    }
    in_RDI->valid = false;
    in_RDI->next = pcdata_free;
    pcdata_free = in_RDI;
  }
  return;
}

Assistant:

void free_pcdata(PC_DATA *pcdata)
{
	if (!(pcdata != nullptr && pcdata->valid))
		return;

	free_pstring(pcdata->pwd);
	free_pstring(pcdata->bamfin);
	free_pstring(pcdata->bamfout);
	free_pstring(pcdata->title);
	free_buf(pcdata->buffer);

	for (int i = 0; i < 100; i++)
	{
		if (pcdata->recentkills[i] != nullptr)
			free_pstring(pcdata->recentkills[i]);
	}

	/*
	for (alias = 0; alias < MAX_ALIAS; alias++)
	{
		if(pcdata->alias[alias] != nullptr)
		{
			free_pstring(pcdata->alias[alias]);
			free_pstring(pcdata->alias_sub[alias]);
		}
	}
	*/

	pcdata->valid = false;

	pcdata->next = pcdata_free;
	pcdata_free = pcdata;
}